

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

void __thiscall cmDependsFortran::MatchLocalModules(cmDependsFortran *this)

{
  char *stampDir;
  cmDependsFortranInternals *pcVar1;
  _Base_ptr p_Var2;
  
  stampDir = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
  pcVar1 = this->Internal;
  for (p_Var2 = (pcVar1->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pcVar1->TargetProvides)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    ConsiderModule(this,*(char **)(p_Var2 + 1),stampDir);
  }
  return;
}

Assistant:

void cmDependsFortran::MatchLocalModules()
{
  const char* stampDir = this->TargetDirectory.c_str();
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::set<std::string>::const_iterator i = provides.begin();
       i != provides.end(); ++i) {
    this->ConsiderModule(i->c_str(), stampDir);
  }
}